

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnStartFunction(BinaryReaderIR *this,Index func_index)

{
  Module *this_00;
  undefined4 index;
  size_type sVar1;
  Location local_b0;
  unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_> local_90;
  Location local_88;
  undefined1 local_68 [8];
  Var start;
  Index func_index_local;
  BinaryReaderIR *this_local;
  
  start.field_2._28_4_ = func_index;
  sVar1 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size(&this->module_->funcs);
  index = start.field_2._28_4_;
  if (func_index < sVar1) {
    GetLocation(&local_88,this);
    Var::Var((Var *)local_68,index,&local_88);
    this_00 = this->module_;
    GetLocation(&local_b0,this);
    MakeUnique<wabt::StartModuleField,wabt::Var&,wabt::Location>
              ((wabt *)&local_90,(Var *)local_68,&local_b0);
    Module::AppendField(this_00,&local_90);
    std::unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>::
    ~unique_ptr(&local_90);
    Result::Result((Result *)((long)&this_local + 4),Ok);
    Var::~Var((Var *)local_68);
    return (Result)this_local._4_4_;
  }
  __assert_fail("func_index < module_->funcs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                ,0x236,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnStartFunction(Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnStartFunction(Index func_index) {
  assert(func_index < module_->funcs.size());
  Var start(func_index, GetLocation());
  module_->AppendField(MakeUnique<StartModuleField>(start, GetLocation()));
  return Result::Ok;
}